

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCaseFilter::isMatch(TestCaseFilter *this,TestCase *testCase)

{
  TestCaseInfo *pTVar1;
  logic_error *this_00;
  TestCase *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string name;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa0;
  string *this_01;
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  __type local_1;
  
  pTVar1 = TestCase::getTestCaseInfo(in_RSI);
  this_01 = (string *)&stack0xffffffffffffffc8;
  std::__cxx11::string::string(this_01,(string *)pTVar1);
  toLowerInPlace(in_stack_ffffffffffffffa0);
  switch(*(undefined4 *)(in_RDI + 0x24)) {
  case 0:
    local_1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this_01,in_RDI);
    break;
  case 1:
    local_1 = endsWith(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    break;
  case 2:
    local_1 = startsWith(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    break;
  case 3:
    local_1 = contains(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unhandled wildcard type");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return local_1;
}

Assistant:

bool isMatch( TestCase const& testCase ) const {
            std::string name = testCase.getTestCaseInfo().name;
            toLowerInPlace( name );

            switch( m_wildcardPosition ) {
                case NoWildcard:
                    return m_stringToMatch == name;
                case WildcardAtStart:
                    return endsWith( name, m_stringToMatch );
                case WildcardAtEnd:
                    return startsWith( name, m_stringToMatch );
                case WildcardAtBothEnds:
                    return contains( name, m_stringToMatch );
            }
            throw std::logic_error( "Unhandled wildcard type" );
        }